

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcat_s.c
# Opt level: O2

errno_t strcat_s(char *dest,rsize_t dmax,char *src)

{
  char cVar1;
  long lVar2;
  long lVar3;
  rsize_t rVar4;
  errno_t error;
  errno_t eVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    pcVar6 = "strcat_s: dest is null";
  }
  else {
    if (src != (char *)0x0) {
      if (dmax == 0) {
        pcVar6 = "strcat_s: dmax is 0";
        eVar5 = 0x191;
        error = 0x191;
      }
      else if (dmax < 0x10000001) {
        pcVar6 = dest;
        if (dest < src) {
          do {
            if (*pcVar6 == '\0') {
              rVar4 = 0;
              goto LAB_001048fc;
            }
            if (pcVar6 == src) goto LAB_0010491b;
            dmax = dmax - 1;
            pcVar6 = pcVar6 + 1;
          } while (dmax != 0);
        }
        else {
          rVar4 = 0;
          do {
            if (dest[rVar4] == '\0') {
              lVar3 = 0;
              goto LAB_001048d7;
            }
            rVar4 = rVar4 + 1;
          } while (dmax != rVar4);
        }
        *dest = '\0';
        pcVar6 = "strcat_s: dest unterminated";
        eVar5 = 0x197;
        error = 0x197;
      }
      else {
        pcVar6 = "strcat_s: dmax exceeds max";
        eVar5 = 0x193;
        error = 0x193;
      }
      goto LAB_00104858;
    }
    pcVar6 = "strcat_s: src is null";
  }
  eVar5 = 400;
  error = 400;
  goto LAB_00104858;
LAB_001048d7:
  if (dmax - rVar4 == lVar3) goto LAB_00104936;
  if (src + lVar3 == dest) goto LAB_0010491b;
  cVar1 = src[lVar3];
  dest[rVar4 + lVar3] = cVar1;
  if (cVar1 == '\0') goto LAB_00104951;
  lVar3 = lVar3 + 1;
  goto LAB_001048d7;
LAB_001048fc:
  if (dmax == rVar4) goto LAB_00104936;
  if (pcVar6 + rVar4 == src) goto LAB_0010491b;
  cVar1 = src[rVar4];
  pcVar6[rVar4] = cVar1;
  if (cVar1 == '\0') goto LAB_00104951;
  rVar4 = rVar4 + 1;
  goto LAB_001048fc;
LAB_00104936:
  *dest = '\0';
  pcVar6 = "strcat_s: not enough space for src";
  eVar5 = 0x196;
  error = 0x196;
  goto LAB_00104858;
LAB_00104951:
  eVar5 = 0;
  goto LAB_0010485d;
LAB_0010491b:
  *dest = '\0';
  pcVar6 = "strcat_s: overlapping objects";
  eVar5 = 0x194;
  error = 0x194;
LAB_00104858:
  invoke_safe_str_constraint_handler(pcVar6,(void *)0x0,error);
LAB_0010485d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return eVar5;
}

Assistant:

errno_t
strcat_s (char *dest, rsize_t dmax, const char *src)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcat_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcat_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcat_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcat_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        /* Find the end of dest */
        while (*dest != '\0') {

            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            dest++;
            dmax--;
            if (dmax == 0) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "dest unterminated",
                             ESUNTERM);
                return RCNEGATE(ESUNTERM);
            }
        }

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        /* Find the end of dest */
        while (*dest != '\0') {

            /*
             * NOTE: no need to check for overlap here since src comes first
             * in memory and we're not incrementing src here.
             */
            dest++;
            dmax--;
            if (dmax == 0) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "dest unterminated",
                             ESUNTERM);
                return RCNEGATE(ESUNTERM);
            }
        }

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src was not copied, so null the string
     */
    handle_error(orig_dest, orig_dmax, "strcat_s: not enough "
                      "space for src",
                      ESNOSPC);

    return RCNEGATE(ESNOSPC);
}